

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

double __thiscall vera::gamma(vera *this,double param_1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  float extraout_XMM0_Da;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar6;
  
  iVar1 = (**(code **)(*(long *)this + 0x30))();
  iVar2 = (**(code **)(*(long *)this + 0x38))(this);
  iVar3 = (**(code **)(*(long *)this + 0x40))(this);
  iVar3 = iVar3 * iVar2 * iVar1;
  iVar1 = 0;
  fVar5 = extraout_XMM0_Da;
  uVar6 = extraout_XMM0_Db;
  if (iVar3 < 1) {
    iVar3 = iVar1;
  }
  for (; iVar3 != iVar1; iVar1 = iVar1 + 1) {
    pfVar4 = (float *)(**(code **)(*(long *)this + 0x60))(this,iVar1);
    fVar5 = powf(*pfVar4,SUB84(param_1,0));
    pfVar4 = (float *)(**(code **)(*(long *)this + 0x60))(this,iVar1);
    uVar6 = 0;
    *pfVar4 = fVar5;
  }
  return (double)CONCAT44(uVar6,fVar5);
}

Assistant:

void gamma(Image& _image, float _gamma) {
    int total = _image.getWidth() * _image.getHeight() * _image.getChannels();
    for (int i = 0; i < total; i++)
        _image[i] = std::pow(_image[i], _gamma);
}